

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcBlast.c
# Opt level: O2

void Wlc_BlastSubtract(Gia_Man_t *pNew,int *pAdd0,int *pAdd1,int nBits,int Carry)

{
  int a;
  int b;
  ulong uVar1;
  ulong uVar2;
  int local_3c;
  int *local_38;
  
  uVar2 = 0;
  uVar1 = (ulong)(uint)nBits;
  if (nBits < 1) {
    uVar1 = uVar2;
  }
  local_3c = Carry;
  local_38 = pAdd1;
  for (; uVar1 * 4 != uVar2; uVar2 = uVar2 + 4) {
    a = *(int *)((long)pAdd0 + uVar2);
    b = Abc_LitNot(*(int *)((long)local_38 + uVar2));
    Wlc_BlastFullAdder(pNew,a,b,local_3c,&local_3c,(int *)((long)pAdd0 + uVar2));
  }
  return;
}

Assistant:

void Wlc_BlastSubtract( Gia_Man_t * pNew, int * pAdd0, int * pAdd1, int nBits, int Carry ) // result is in pAdd0
{
    int b;
    for ( b = 0; b < nBits; b++ )
        Wlc_BlastFullAdder( pNew, pAdd0[b], Abc_LitNot(pAdd1[b]), Carry, &Carry, &pAdd0[b] );
}